

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O1

LoadResult * __thiscall
slang::driver::SourceLoader::loadAndParse
          (LoadResult *__return_storage_ptr__,SourceLoader *this,FileEntry *entry,Bag *optionBag,
          SourceOptions *srcOptions,uint64_t fileSortKey)

{
  UnitEntry *pUVar1;
  BufferOrError buffer;
  shared_ptr<slang::syntax::SyntaxTree> tree;
  anon_union_32_2_293c120a_for_storage_t_impl<slang::SourceBuffer,_std::error_code>_2 local_b8;
  char local_98;
  undefined1 local_88 [16];
  SourceLibrary *local_78;
  SourceManager *pSStack_70;
  char local_68;
  anon_union_32_2_293c120a_for_storage_t_impl<slang::SourceBuffer,_std::error_code>_2 local_58;
  char local_38;
  
  local_98 = '\x01';
  local_b8.m_value.data._M_len = 0;
  local_b8.m_value.data._M_str = (char *)0x0;
  local_b8.m_value.library = (SourceLibrary *)0x0;
  local_b8._24_8_ = 0;
  if ((entry->preloadedBuffer).id.id == 0) {
    SourceManager::readSource
              ((BufferOrError *)&local_58.m_value,this->sourceManager,&entry->path,entry->library,
               fileSortKey);
    local_68 = local_38;
    if (local_38 == '\x01') {
      local_78 = local_58.m_value.library;
      pSStack_70 = (SourceManager *)local_58._24_8_;
    }
    local_88._4_4_ = local_58.m_value.data._M_len._4_4_;
    local_88._0_4_ = local_58.m_error._M_value;
    local_88._12_4_ = local_58._12_4_;
    local_88._8_4_ = local_58._8_4_;
  }
  else {
    local_88._0_8_ = (entry->preloadedBuffer).data._M_len;
    local_88._8_8_ = (entry->preloadedBuffer).data._M_str;
    local_78 = (entry->preloadedBuffer).library;
    pSStack_70 = *(SourceManager **)&(entry->preloadedBuffer).id;
    local_68 = '\x01';
  }
  nonstd::expected_lite::expected<slang::SourceBuffer,std::error_code>::
  swap<slang::SourceBuffer,std::error_code>
            ((expected<slang::SourceBuffer,std::error_code> *)local_88,
             (expected<slang::SourceBuffer,_std::error_code> *)&local_b8.m_value);
  if (local_98 == '\0') {
    *(size_t *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             ).
             super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             .
             super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
             ._M_u + 8) = local_b8.m_value.data._M_len;
    *(char **)((long)&(__return_storage_ptr__->
                      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      ).
                      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      .
                      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                      ._M_u + 0x10) = local_b8.m_value.data._M_str;
    *(FileEntry **)
     &(__return_storage_ptr__->
      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ).
      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ._M_u = entry;
    (__return_storage_ptr__->
    super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    ).
    super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    .
    super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
    ._M_index = '\x02';
  }
  else {
    pUVar1 = entry->unit;
    if (pUVar1 == (UnitEntry *)0x0) {
      if ((entry->isLibraryFile == false) && (srcOptions->singleUnit == true)) {
        *(SourceLibrary **)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x10) = local_b8.m_value.library;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x18) = local_b8._24_8_;
        *(size_t *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_b8.m_value.data._M_len;
        *(char **)((long)&(__return_storage_ptr__->
                          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ).
                          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ._M_u + 8) = local_b8.m_value.data._M_str;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x20) = 0;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\x01';
      }
      else if (srcOptions->librariesInheritMacros == true) {
        *(SourceLibrary **)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x10) = local_b8.m_value.library;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x18) = local_b8._24_8_;
        *(size_t *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_b8.m_value.data._M_len;
        *(char **)((long)&(__return_storage_ptr__->
                          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ).
                          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          .
                          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                          ._M_u + 8) = local_b8.m_value.data._M_str;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 0x20) = 1;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\x01';
      }
      else {
        slang::syntax::SyntaxTree::fromBuffer
                  ((SyntaxTree *)local_88,&local_b8.m_value,this->sourceManager,optionBag,
                   (MacroList)ZEXT816(0));
        if ((entry->isLibraryFile != false) || (srcOptions->onlyLint == true)) {
          *(undefined1 *)local_88._0_8_ = 1;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 8) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ).
          super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          .
          super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
          ._M_u = local_88._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ).
                 super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 .
                 super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                 ._M_u + 8) = local_88._8_8_;
        (__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_index = '\0';
      }
    }
    else {
      *(SourceLibrary **)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x10) = local_b8.m_value.library;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x18) = local_b8._24_8_;
      *(size_t *)
       &(__return_storage_ptr__->
        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ).
        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        .
        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
        ._M_u = local_b8.m_value.data._M_len;
      *(char **)((long)&(__return_storage_ptr__->
                        super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        ).
                        super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        .
                        super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
                        ._M_u + 8) = local_b8.m_value.data._M_str;
      *(UnitEntry **)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ).
               super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               .
               super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
               ._M_u + 0x20) = pUVar1;
      (__return_storage_ptr__->
      super__Variant_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ).
      super__Move_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_assign_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Move_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Copy_ctor_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      .
      super__Variant_storage_alias<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
      ._M_index = '\x03';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SourceLoader::LoadResult SourceLoader::loadAndParse(const FileEntry& entry, const Bag& optionBag,
                                                    const SourceOptions& srcOptions,
                                                    uint64_t fileSortKey) {
    // TODO: error if secondLib is set

    SourceManager::BufferOrError buffer;
    if (entry.preloadedBuffer)
        buffer = entry.preloadedBuffer;
    else
        buffer = sourceManager.readSource(entry.path, entry.library, fileSortKey);

    if (!buffer)
        return std::pair{&entry, buffer.error()};

    if (entry.unit) {
        return std::pair{*buffer, entry.unit};
    }
    else if (!entry.isLibraryFile && srcOptions.singleUnit) {
        // If this file was directly specified (i.e. not via
        // a library mapping) and we're in single-unit mode,
        // collect it for later parsing.
        return std::pair{*buffer, false};
    }
    else if (srcOptions.librariesInheritMacros) {
        // If libraries inherit macros then we can't parse here,
        // we need to wait for the main compilation unit to be parsed.
        SLANG_ASSERT(entry.isLibraryFile);
        return std::pair{*buffer, true};
    }
    else {
        // Otherwise we can parse right away.
        auto tree = SyntaxTree::fromBuffer(*buffer, sourceManager, optionBag);
        if (entry.isLibraryFile || srcOptions.onlyLint)
            tree->isLibraryUnit = true;

        return tree;
    }
}